

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O3

bool hasDuplicates<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys)

{
  long lVar1;
  size_t __n;
  int iVar2;
  size_t *psVar3;
  size_t *psVar4;
  long in_RSI;
  long lVar5;
  long lVar6;
  
  if (in_RSI - (long)keys != 0) {
    psVar3 = (size_t *)(in_RSI + -0x38);
    lVar5 = in_RSI - (long)keys >> 5;
    do {
      if (lVar5 == 1) {
        return false;
      }
      lVar1 = lVar5 + -1;
      __n = *(size_t *)((long)keys + lVar1 * 0x20 + 8);
      lVar6 = 1;
      psVar4 = psVar3;
      do {
        if (__n == *psVar4) {
          if (__n == 0) {
            return true;
          }
          iVar2 = bcmp(*(void **)((long)keys + lVar1 * 0x20),(void *)psVar4[-1],__n);
          if (iVar2 == 0) {
            return true;
          }
        }
        lVar6 = lVar6 + 1;
        psVar4 = psVar4 + -4;
      } while (lVar5 != lVar6);
      psVar3 = psVar3 + -4;
      lVar5 = lVar1;
    } while (lVar1 != 0);
  }
  return false;
}

Assistant:

static bool hasDuplicates(const std::vector<KeyType>& keys){
    for(size_t i = keys.size()-1; i < std::numeric_limits<size_t>::max(); i--)
        for(size_t j = i-1; j < std::numeric_limits<size_t>::max(); j--)
            if(keys[i] == keys[j]) return true;

    return false;
}